

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlTextReaderSetErrorHandler(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 *puVar2;
  PyObject *pPVar3;
  Py_ssize_t PVar4;
  PyObject *pyobj_f;
  PyObject *pyobj_arg;
  PyObject *pyobj_reader;
  xmlTextReaderErrorFunc f;
  void *arg;
  
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOO:xmlTextReaderSetErrorHandler",&pyobj_reader,&pyobj_f,&pyobj_arg);
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (pyobj_reader == (PyObject *)&_Py_NoneStruct) {
    PVar4 = 0;
  }
  else {
    PVar4 = pyobj_reader[1].ob_refcnt;
  }
  xmlTextReaderGetErrorHandler(PVar4,&f,&arg);
  iVar1 = -1;
  if (arg != (void *)0x0) {
    if (f != libxml_xmlTextReaderErrorCallback) goto LAB_0013ddb5;
    _Py_XDECREF(*arg);
    _Py_XDECREF(*(PyObject **)((long)arg + 8));
    (*_xmlFree)(arg);
  }
  xmlTextReaderSetErrorHandler(PVar4,0,0);
  if (pyobj_f != (PyObject *)&_Py_NoneStruct) {
    puVar2 = (undefined8 *)(*_xmlMalloc)(0x10);
    if (puVar2 == (undefined8 *)0x0) goto LAB_0013ddb5;
    if (pyobj_f != (PyObject *)0x0) {
      pyobj_f->ob_refcnt = pyobj_f->ob_refcnt + 1;
    }
    *puVar2 = pyobj_f;
    if (pyobj_arg != (PyObject *)0x0) {
      pyobj_arg->ob_refcnt = pyobj_arg->ob_refcnt + 1;
    }
    puVar2[1] = pyobj_arg;
    xmlTextReaderSetErrorHandler(PVar4,libxml_xmlTextReaderErrorCallback,puVar2);
  }
  iVar1 = 1;
LAB_0013ddb5:
  pPVar3 = libxml_intWrap(iVar1);
  return pPVar3;
}

Assistant:

static PyObject *
libxml_xmlTextReaderSetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args)
{
    xmlTextReaderPtr reader;
    xmlTextReaderPyCtxtPtr pyCtxt;
    xmlTextReaderErrorFunc f;
    void *arg;
    PyObject *pyobj_reader;
    PyObject *pyobj_f;
    PyObject *pyobj_arg;
    PyObject *py_retval;

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlTextReaderSetErrorHandler", &pyobj_reader, &pyobj_f, &pyobj_arg))
        return(NULL);
    reader = (xmlTextReaderPtr) PyxmlTextReader_Get(pyobj_reader);
    /* clear previous error handler */
    xmlTextReaderGetErrorHandler(reader,&f,&arg);
    if (arg != NULL) {
	if (f == (xmlTextReaderErrorFunc) libxml_xmlTextReaderErrorCallback) {
	    /* ok, it's our error handler! */
	    pyCtxt = (xmlTextReaderPyCtxtPtr)arg;
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	else {
	    /* 
	     * there already an arg, and it's not ours,
	     * there is definitely something wrong going on here...
	     * we don't know how to free it, so we bail out... 
	     */
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
    }
    xmlTextReaderSetErrorHandler(reader,NULL,NULL);
    /* set new error handler */
    if (pyobj_f != Py_None)
    {
	pyCtxt = (xmlTextReaderPyCtxtPtr)xmlMalloc(sizeof(xmlTextReaderPyCtxt));
	if (pyCtxt == NULL) {
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
	Py_XINCREF(pyobj_f);
	pyCtxt->f = pyobj_f;
	Py_XINCREF(pyobj_arg);
	pyCtxt->arg = pyobj_arg;
	xmlTextReaderSetErrorHandler(reader,
	                             libxml_xmlTextReaderErrorCallback,
	                             pyCtxt);
    }

    py_retval = libxml_intWrap(1);
    return(py_retval);
}